

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

CURLcode Curl_cpool_add(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  long lVar2;
  curl_trc_feat *pcVar3;
  char *__s;
  cpool *cpool;
  cpool_bundle *l;
  size_t sVar4;
  void *pvVar5;
  CURLcode CVar6;
  
  cpool = cpool_get_instance(data);
  if (cpool == (cpool *)0x0) {
    return CURLE_FAILED_INIT;
  }
  if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  cpool->field_0x68 = cpool->field_0x68 | 1;
  l = cpool_find_bundle(cpool,conn);
  if (l == (cpool_bundle *)0x0) {
    __s = conn->destination;
    sVar4 = strlen(__s);
    l = (cpool_bundle *)(*Curl_ccalloc)(1,sVar4 + 0x30);
    CVar6 = CURLE_OUT_OF_MEMORY;
    if (l == (cpool_bundle *)0x0) goto LAB_00119bb0;
    Curl_llist_init((Curl_llist *)l,(Curl_llist_dtor)0x0);
    sVar4 = sVar4 + 1;
    l->dest_len = sVar4;
    memcpy(l->dest,__s,sVar4);
    pvVar5 = Curl_hash_add(&cpool->dest2bundle,l->dest,sVar4,l);
    if (pvVar5 == (void *)0x0) {
      (*Curl_cfree)(l);
      CVar6 = CURLE_OUT_OF_MEMORY;
      goto LAB_00119bb0;
    }
  }
  Curl_llist_append(&l->conns,conn,&conn->cpool_node);
  puVar1 = &(conn->bits).field_0x4;
  *puVar1 = *puVar1 | 1;
  lVar2 = cpool->next_connection_id;
  cpool->next_connection_id = lVar2 + 1;
  conn->connection_id = lVar2;
  cpool->num_conn = cpool->num_conn + 1;
  CVar6 = CURLE_OK;
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))) &&
     (CVar6 = CURLE_OK, 0 < Curl_trc_feat_multi.log_level)) {
    CVar6 = CURLE_OK;
    Curl_trc_multi(data,"[CPOOL] added connection %ld. The cache now contains %zu members");
  }
LAB_00119bb0:
  cpool->field_0x68 = cpool->field_0x68 & 0xfe;
  if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
  }
  return CVar6;
}

Assistant:

CURLcode Curl_cpool_add(struct Curl_easy *data,
                        struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct cpool_bundle *bundle = NULL;
  struct cpool *cpool = cpool_get_instance(data);
  DEBUGASSERT(conn);

  DEBUGASSERT(cpool);
  if(!cpool)
    return CURLE_FAILED_INIT;

  CPOOL_LOCK(cpool, data);
  bundle = cpool_find_bundle(cpool, conn);
  if(!bundle) {
    bundle = cpool_add_bundle(cpool, conn);
    if(!bundle) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

  cpool_bundle_add(bundle, conn);
  conn->connection_id = cpool->next_connection_id++;
  cpool->num_conn++;
  CURL_TRC_M(data, "[CPOOL] added connection %" FMT_OFF_T ". "
             "The cache now contains %zu members",
             conn->connection_id, cpool->num_conn);
out:
  CPOOL_UNLOCK(cpool, data);

  return result;
}